

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsts.c
# Opt level: O0

CURLcode Curl_hsts_save(Curl_easy *data,hsts *h,char *file)

{
  int iVar1;
  _Bool local_71;
  stsentry *psStack_70;
  _Bool stop;
  stsentry *sts_1;
  curl_index i;
  stsentry *sts;
  char *tempstore;
  FILE *out;
  Curl_llist_node *pCStack_38;
  CURLcode result;
  Curl_llist_node *n;
  Curl_llist_node *e;
  char *file_local;
  hsts *h_local;
  Curl_easy *data_local;
  
  out._4_4_ = CURLE_OK;
  sts = (stsentry *)0x0;
  if (h == (hsts *)0x0) {
    data_local._4_4_ = CURLE_OK;
  }
  else {
    e = (Curl_llist_node *)file;
    if ((file == (char *)0x0) && (h->filename != (char *)0x0)) {
      e = (Curl_llist_node *)h->filename;
    }
    file_local = (char *)h;
    h_local = (hsts *)data;
    if ((((h->flags & 2) == 0) && (e != (Curl_llist_node *)0x0)) && (*(char *)&e->_list != '\0')) {
      out._4_4_ = Curl_fopen(data,(char *)e,(FILE **)&tempstore,(char **)&sts);
      if (out._4_4_ == CURLE_OK) {
        fputs("# Your HSTS cache. https://curl.se/docs/hsts.html\n# This file was generated by libcurl! Edit at your own risk.\n"
              ,(FILE *)tempstore);
        n = Curl_llist_head((Curl_llist *)file_local);
        while (n != (Curl_llist_node *)0x0) {
          i.total = (size_t)Curl_node_elem(n);
          pCStack_38 = Curl_node_next(n);
          out._4_4_ = hsts_out((stsentry *)i.total,(FILE *)tempstore);
          if (out._4_4_ != CURLE_OK) break;
          n = pCStack_38;
        }
        fclose((FILE *)tempstore);
        if (((out._4_4_ == CURLE_OK) && (sts != (stsentry *)0x0)) &&
           (iVar1 = Curl_rename((char *)sts,(char *)e), iVar1 != 0)) {
          out._4_4_ = CURLE_WRITE_ERROR;
        }
        if ((out._4_4_ != CURLE_OK) && (sts != (stsentry *)0x0)) {
          unlink((char *)sts);
        }
      }
      (*Curl_cfree)(sts);
    }
    if (h_local[0xf].list._tail != (Curl_llist_node *)0x0) {
      i.index = Curl_llist_count((Curl_llist *)file_local);
      sts_1 = (stsentry *)0x0;
      n = Curl_llist_head((Curl_llist *)file_local);
      while (n != (Curl_llist_node *)0x0) {
        psStack_70 = (stsentry *)Curl_node_elem(n);
        pCStack_38 = Curl_node_next(n);
        out._4_4_ = hsts_push((Curl_easy *)h_local,(curl_index *)&sts_1,psStack_70,&local_71);
        if ((out._4_4_ != CURLE_OK) || ((local_71 & 1U) != 0)) break;
        sts_1 = (stsentry *)((long)&(sts_1->node)._list + 1);
        n = pCStack_38;
      }
    }
    data_local._4_4_ = out._4_4_;
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_hsts_save(struct Curl_easy *data, struct hsts *h,
                        const char *file)
{
  struct Curl_llist_node *e;
  struct Curl_llist_node *n;
  CURLcode result = CURLE_OK;
  FILE *out;
  char *tempstore = NULL;

  if(!h)
    /* no cache activated */
    return CURLE_OK;

  /* if no new name is given, use the one we stored from the load */
  if(!file && h->filename)
    file = h->filename;

  if((h->flags & CURLHSTS_READONLYFILE) || !file || !file[0])
    /* marked as read-only, no file or zero length filename */
    goto skipsave;

  result = Curl_fopen(data, file, &out, &tempstore);
  if(!result) {
    fputs("# Your HSTS cache. https://curl.se/docs/hsts.html\n"
          "# This file was generated by libcurl! Edit at your own risk.\n",
          out);
    for(e = Curl_llist_head(&h->list); e; e = n) {
      struct stsentry *sts = Curl_node_elem(e);
      n = Curl_node_next(e);
      result = hsts_out(sts, out);
      if(result)
        break;
    }
    fclose(out);
    if(!result && tempstore && Curl_rename(tempstore, file))
      result = CURLE_WRITE_ERROR;

    if(result && tempstore)
      unlink(tempstore);
  }
  free(tempstore);
skipsave:
  if(data->set.hsts_write) {
    /* if there is a write callback */
    struct curl_index i; /* count */
    i.total = Curl_llist_count(&h->list);
    i.index = 0;
    for(e = Curl_llist_head(&h->list); e; e = n) {
      struct stsentry *sts = Curl_node_elem(e);
      bool stop;
      n = Curl_node_next(e);
      result = hsts_push(data, &i, sts, &stop);
      if(result || stop)
        break;
      i.index++;
    }
  }
  return result;
}